

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlErrorPtrWrap(xmlErrorPtr error)

{
  PyObject *ret;
  xmlErrorPtr error_local;
  
  if (error == (xmlErrorPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    error_local = (xmlErrorPtr)&_Py_NoneStruct;
  }
  else {
    error_local = (xmlErrorPtr)PyCapsule_New(error,"xmlErrorPtr",0);
  }
  return (PyObject *)error_local;
}

Assistant:

PyObject *
libxml_xmlErrorPtrWrap(xmlErrorPtr error)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlErrorPtrWrap: error = %p\n", error);
#endif
    if (error == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) error, (char *) "xmlErrorPtr", NULL);
    return (ret);
}